

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

void __thiscall
despot::SimpleRockSampleParticleUpperBound::SimpleRockSampleParticleUpperBound
          (SimpleRockSampleParticleUpperBound *this,DSPOMDP *model)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  double *pdVar1;
  pointer pvVar2;
  long lVar3;
  double dVar4;
  double local_38;
  double local_30;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  *(undefined ***)this = &PTR__SimpleRockSampleParticleUpperBound_0010bc68;
  this_00 = &this->upper_bounds_;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_00,3);
  local_38 = __Init * 10.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_38);
  local_38 = __Init * __Init * 10.0 + 10.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_38);
  local_38 = 10.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,&local_38);
  pvVar2 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_30 = __Init;
  dVar4 = pow(__Init,3.0);
  local_38 = local_30 * 10.0 + dVar4 * 10.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar2 + 1,&local_38);
  pvVar2 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  pdVar1 = (double *)(lVar3 + 8);
  if (*pdVar1 <= 10.0 && *pdVar1 != 10.0) {
    *(undefined8 *)(lVar3 + 8) = 0x4024000000000000;
  }
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar2 + 2,&local_38);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,&local_38);
  return;
}

Assistant:

SimpleRockSampleParticleUpperBound(const DSPOMDP* model) {
		upper_bounds_.resize(3);
		upper_bounds_[0].push_back(Globals::Discount(1) * 10);
		upper_bounds_[0].push_back(10 + Globals::Discount(2) * 10);
		upper_bounds_[1].push_back(10);
		upper_bounds_[1].push_back(Globals::Discount(1) * 10 + Globals::Discount(3) * 10);
		if (upper_bounds_[1][1] < 10)
			upper_bounds_[1][1] = 10;
		upper_bounds_[2].push_back(0);
		upper_bounds_[2].push_back(0);
	}